

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_len_ran_interval(ly_ctx *ctx,char *str_restr,lys_type *type,len_ran_intv **ret)

{
  int64_t *num;
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  len_ran_intv *plVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  lys_type_bit *plVar10;
  len_ran_intv *plVar11;
  ushort **ppuVar12;
  ulonglong uVar13;
  ulong uVar14;
  long lVar15;
  len_ran_intv *plVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  len_ran_intv *plVar20;
  ulong uVar21;
  ulong uVar22;
  len_ran_intv *__ptr;
  len_ran_intv *local_80;
  ly_ctx *local_78;
  uint local_6c;
  char *local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = (len_ran_intv *)0x0;
  iVar7 = -1;
  uVar6 = type->base - LY_TYPE_BINARY;
  if (0x12 < uVar6) {
    return -1;
  }
  uVar8 = (long)&switchD_0011460b::switchdataD_00195630 +
          (long)(int)(&switchD_0011460b::switchdataD_00195630)[uVar6];
  uVar17 = 0xffffffffffffffff;
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UINT64:
    if (str_restr == (char *)0x0) {
      plVar10 = (type->info).bits.bit;
      local_60 = uVar17;
      break;
    }
    local_60 = 0xffffffffffffffff;
LAB_00114708:
    local_58 = CONCAT71((int7)(uVar8 >> 8),1);
    goto LAB_00114716;
  default:
    goto switchD_0011460b_caseD_2;
  case LY_TYPE_DEC64:
    uVar6 = (uint)(type->info).dec64.dig;
    if (str_restr == (char *)0x0) {
      plVar10 = (type->info).bits.bit;
      local_48 = CONCAT44(local_48._4_4_,2);
      local_40 = 0;
      local_58 = 0;
      if (plVar10 == (lys_type_bit *)0x0) {
        str_restr = (char *)0x0;
        goto LAB_001146b2;
      }
      local_50 = 0;
      local_38 = 0;
      local_60 = 0;
      goto LAB_001148a4;
    }
LAB_001146b2:
    local_48 = CONCAT44(local_48._4_4_,2);
    local_40 = 0;
    local_50 = 0;
    local_58 = 0;
    local_38 = 0;
    local_60 = 0;
    goto LAB_001148a7;
  case LY_TYPE_INT8:
    if (str_restr != (char *)0x0) {
      local_38 = 0x7f;
      uVar9 = 0xffffffffffffff80;
      local_40 = 0xffffffffffffff80;
      goto LAB_0011474c;
    }
    plVar10 = (type->info).bits.bit;
    local_38 = 0x7f;
    local_40 = 0xffffffffffffff80;
LAB_0011487d:
    local_48 = CONCAT44(local_48._4_4_,1);
    local_50 = 1;
    local_60 = 0;
    local_58 = 0;
    if (plVar10 != (lys_type_bit *)0x0) goto LAB_001148a2;
    str_restr = (char *)0x0;
    goto LAB_00114762;
  case LY_TYPE_UINT8:
    if (str_restr != (char *)0x0) {
      uVar8 = 0xff;
      local_60 = uVar8;
      goto LAB_00114708;
    }
    plVar10 = (type->info).bits.bit;
    uVar17 = 0xff;
    local_60 = uVar17;
    break;
  case LY_TYPE_INT16:
    if (str_restr == (char *)0x0) {
      plVar10 = (type->info).bits.bit;
      local_38 = 0x7fff;
      local_40 = 0xffffffffffff8000;
      goto LAB_0011487d;
    }
    uVar9 = 0x7fff;
    local_38 = 0x7fff;
    local_40 = 0xffffffffffff8000;
    goto LAB_0011474c;
  case LY_TYPE_UINT16:
    if (str_restr != (char *)0x0) {
      uVar8 = 0xffff;
      local_60 = uVar8;
      goto LAB_00114708;
    }
    plVar10 = (type->info).bits.bit;
    uVar17 = 0xffff;
    local_60 = uVar17;
    break;
  case LY_TYPE_INT32:
    if (str_restr == (char *)0x0) {
      plVar10 = (type->info).bits.bit;
      local_38 = 0x7fffffff;
      local_40 = 0xffffffff80000000;
      goto LAB_0011487d;
    }
    uVar9 = 0x7fffffff;
    local_38 = 0x7fffffff;
    local_40 = 0xffffffff80000000;
LAB_0011474c:
    local_50 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
LAB_0011475a:
    local_48 = CONCAT44(local_48._4_4_,1);
    local_58 = 0;
    local_60 = 0;
    goto LAB_00114762;
  case LY_TYPE_UINT32:
    uVar8 = 0xffffffff;
    local_60 = uVar8;
    if (str_restr != (char *)0x0) goto LAB_00114708;
    local_60 = 0xffffffff;
    plVar10 = (type->info).bits.bit;
    break;
  case LY_TYPE_INT64:
    local_38 = 0x7fffffffffffffff;
    if (str_restr == (char *)0x0) {
      plVar10 = (type->info).bits.bit;
      local_40 = 0x8000000000000000;
      local_60 = 0;
      local_48 = CONCAT44(local_48._4_4_,1);
      local_50 = 1;
      local_58 = 0;
      if (plVar10 != (lys_type_bit *)0x0) {
        uVar6 = 0;
        goto LAB_001148a4;
      }
      str_restr = (char *)0x0;
      uVar6 = 0;
      goto LAB_001148a7;
    }
    local_40 = 0x8000000000000000;
    local_50 = 0x8000000000000001;
    goto LAB_0011475a;
  }
  local_50 = 0;
  local_58 = CONCAT71((int7)(uVar17 >> 8),1);
  if (plVar10 == (lys_type_bit *)0x0) {
    str_restr = (char *)0x0;
LAB_00114716:
    local_50 = 0;
    local_48 = (ulong)local_48._4_4_ << 0x20;
    local_40 = 0;
    local_38 = 0;
LAB_00114762:
    uVar6 = 0;
  }
  else {
    local_48 = (ulong)local_48._4_4_ << 0x20;
    local_40 = 0;
    local_38 = 0;
LAB_001148a2:
    uVar6 = 0;
LAB_001148a4:
    str_restr = plVar10->name;
  }
LAB_001148a7:
  local_78 = ctx;
  if (type->der == (lys_tpdf *)0x0) {
LAB_00114913:
    __ptr = (len_ran_intv *)0x0;
  }
  else {
    iVar7 = resolve_len_ran_interval(ctx,(char *)0x0,&type->der->type,&local_80);
    if (iVar7 != 0) {
      return -1;
    }
    if (local_80 == (len_ran_intv *)0x0) goto LAB_00114913;
    __ptr = local_80;
    if ((uint)local_48 != local_80->kind) {
      __assert_fail("!intv || (intv->kind == kind)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0xbdf,
                    "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                   );
    }
  }
  if (str_restr != (char *)0x0) {
    uVar17 = 0x7fffffffffffffff;
    uVar8 = local_38;
    if (__ptr == (len_ran_intv *)0x0) {
      uVar21 = 0x8000000000000000;
      uVar22 = 0;
      uVar2 = local_60;
    }
    else {
      uVar2 = (__ptr->value).uval.min;
      uVar14 = local_40;
      if ((char)local_50 != '\0') {
        uVar14 = uVar2;
      }
      uVar21 = uVar2;
      if ((char)local_50 != '\0') {
        uVar21 = 0x8000000000000000;
      }
      uVar22 = 0;
      if ((char)local_58 != '\0') {
        uVar22 = uVar2;
        uVar21 = 0x8000000000000000;
        uVar14 = local_40;
      }
      do {
        local_40 = uVar14;
        plVar16 = __ptr;
        __ptr = plVar16->next;
        uVar14 = local_40;
      } while (__ptr != (len_ran_intv *)0x0);
      uVar14 = (plVar16->value).sval.max;
      uVar2 = uVar14;
      if (((char)local_58 == '\0') && (uVar8 = uVar14, uVar2 = local_60, (char)local_50 == '\0')) {
        uVar17 = uVar14;
        uVar8 = local_38;
      }
    }
    local_60 = uVar2;
    uVar14 = uVar21;
    uVar2 = uVar17;
    if ((char)local_50 != '\0') {
      uVar14 = local_40;
      uVar2 = uVar8;
    }
    if ((char)local_58 != '\0') {
      uVar14 = uVar22;
      uVar2 = local_60;
    }
    __ptr = (len_ran_intv *)0x0;
    plVar16 = (len_ran_intv *)0x0;
    local_6c = uVar6;
    local_38 = uVar8;
    do {
      if (plVar16 == (len_ran_intv *)0x0) {
        if (__ptr != (len_ran_intv *)0x0) {
          __assert_fail("!local_intv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0xc06,
                        "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                       );
        }
        plVar11 = (len_ran_intv *)malloc(0x28);
        __ptr = plVar11;
      }
      else {
        plVar11 = (len_ran_intv *)malloc(0x28);
        plVar16->next = plVar11;
      }
      if (plVar11 == (len_ran_intv *)0x0) {
        ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "resolve_len_ran_interval");
        plVar20 = local_80;
        goto LAB_00114de4;
      }
      plVar11->kind = (uint8_t)local_48;
      plVar11->type = type;
      plVar11->next = (len_ran_intv *)0x0;
      ppuVar12 = __ctype_b_loc();
      pcVar18 = str_restr;
      do {
        local_68 = pcVar18;
        cVar5 = *local_68;
        pcVar18 = local_68 + 1;
      } while (((*ppuVar12)[cVar5] >> 0xd & 1) != 0);
      if ((((*ppuVar12)[cVar5] >> 0xb & 1) != 0) || (cVar5 == '+')) {
LAB_00114a78:
        if ((char)local_58 != '\0') {
          uVar13 = strtoull(local_68,&local_68,10);
LAB_00114aa1:
          (plVar11->value).uval.min = uVar13;
          goto LAB_00114afc;
        }
        if ((char)local_50 != '\0') {
          uVar13 = strtoll(local_68,&local_68,10);
          goto LAB_00114aa1;
        }
        iVar7 = parse_range_dec64(&local_68,(uint8_t)local_6c,(int64_t *)&plVar11->value);
        if (iVar7 == 0) goto LAB_00114afc;
LAB_00114dc3:
        ly_vlog(local_78,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_68,"range");
        plVar20 = local_80;
        goto LAB_00114de4;
      }
      plVar20 = local_80;
      if (cVar5 != 'm') {
        if (cVar5 == '-') goto LAB_00114a78;
        goto LAB_00114de4;
      }
      cVar5 = *pcVar18;
      if (cVar5 == 'i') {
        uVar8 = uVar14;
        if (local_68[2] != 'n') {
          cVar5 = *pcVar18;
          goto LAB_00114ad7;
        }
      }
      else {
LAB_00114ad7:
        if ((cVar5 != 'a') || (uVar8 = uVar2, local_68[2] != 'x')) goto LAB_00114de4;
      }
      (plVar11->value).sval.min = uVar8;
      local_68 = local_68 + 3;
LAB_00114afc:
      pcVar18 = local_68 + 1;
      do {
        pcVar19 = pcVar18;
        cVar5 = pcVar19[-1];
        pcVar18 = pcVar19 + 1;
      } while ((*(byte *)((long)*ppuVar12 + (long)cVar5 * 2 + 1) & 0x20) != 0);
      local_68 = pcVar19 + -1;
      if (cVar5 == '|') {
LAB_00114b32:
        uVar8 = (plVar11->value).sval.min;
        if ((char)local_58 != '\0') goto LAB_00114ba3;
        (plVar11->value).sval.max = uVar8;
        if ((char)local_50 == '\0') goto LAB_00114c3a;
LAB_00114bfa:
        lVar15 = (plVar11->value).sval.min;
        plVar20 = local_80;
        if ((((long)uVar8 < lVar15) || (lVar15 < (long)local_40)) || ((long)local_38 < (long)uVar8))
        goto LAB_00114de4;
LAB_00114c61:
        if ((plVar16 != (len_ran_intv *)0x0) &&
           (plVar20 = local_80, lVar15 <= (plVar16->value).sval.max)) goto LAB_00114de4;
      }
      else {
        plVar20 = local_80;
        if (cVar5 != '.') {
          if (cVar5 == '\0') goto LAB_00114b32;
          goto LAB_00114de4;
        }
        if (*pcVar19 != '.') goto LAB_00114de4;
        do {
          local_68 = pcVar18;
          cVar5 = *local_68;
          uVar1 = (*ppuVar12)[cVar5];
          pcVar18 = local_68 + 1;
        } while ((uVar1 >> 0xd & 1) != 0);
        if (((uVar1 >> 0xb & 1) != 0) || (cVar5 == '+')) {
LAB_00114b8e:
          if ((char)local_58 != '\0') {
            uVar8 = strtoull(local_68,&local_68,10);
            goto LAB_00114ba3;
          }
          if ((char)local_50 != '\0') {
            uVar8 = strtoll(local_68,&local_68,10);
LAB_00114bf6:
            (plVar11->value).sval.max = uVar8;
            goto LAB_00114bfa;
          }
          num = &(plVar11->value).sval.max;
          iVar7 = parse_range_dec64(&local_68,(uint8_t)local_6c,num);
          if (iVar7 != 0) goto LAB_00114dc3;
          uVar8 = *num;
LAB_00114c3a:
          lVar15 = (plVar11->value).sval.min;
          plVar20 = local_80;
          if (((lVar15 <= (long)uVar8) && ((long)uVar21 <= lVar15)) && ((long)uVar8 <= (long)uVar17)
             ) goto LAB_00114c61;
          goto LAB_00114de4;
        }
        if (cVar5 != 'm') {
          if (cVar5 == '-') goto LAB_00114b8e;
          goto LAB_00114de4;
        }
        if ((local_68[1] != 'a') || (local_68[2] != 'x')) goto LAB_00114de4;
        uVar8 = local_60;
        if ((char)local_58 == '\0') {
          uVar8 = local_38;
          if ((char)local_50 != '\0') goto LAB_00114bf6;
          (plVar11->value).sval.max = uVar17;
          uVar8 = uVar17;
          goto LAB_00114c3a;
        }
LAB_00114ba3:
        (plVar11->value).sval.max = uVar8;
        uVar3 = (plVar11->value).uval.min;
        plVar20 = local_80;
        if ((((uVar8 < uVar3) || (uVar3 < uVar22)) || (local_60 < uVar8)) ||
           ((plVar16 != (len_ran_intv *)0x0 && (uVar3 <= (plVar16->value).uval.max))))
        goto LAB_00114de4;
      }
      pcVar18 = strchr(str_restr,0x7c);
      plVar4 = local_80;
      str_restr = pcVar18 + 1;
      plVar16 = plVar11;
    } while (pcVar18 != (char *)0x0);
    plVar11 = __ptr;
    plVar16 = local_80;
    if (local_80 != (len_ran_intv *)0x0) {
LAB_00114d01:
      plVar20 = plVar4;
      if (plVar11 != (len_ran_intv *)0x0) {
        do {
          plVar20 = local_80;
          if (plVar16 == (len_ran_intv *)0x0) goto LAB_00114de4;
          uVar17 = (plVar11->value).sval.min;
          if ((char)local_58 == '\0') {
            if ((char)local_50 == '\0') {
              local_48 = (plVar11->value).sval.max;
              iVar7 = dec64cmp(uVar17,(uint8_t)local_6c,(plVar16->value).sval.min,(uint8_t)local_6c)
              ;
              if ((-1 < iVar7) &&
                 (iVar7 = dec64cmp(uVar17,(uint8_t)local_6c,(plVar16->value).sval.max,
                                   (uint8_t)local_6c), iVar7 < 1)) {
                iVar7 = dec64cmp(local_48,(uint8_t)local_6c,(plVar16->value).sval.max,
                                 (uint8_t)local_6c);
                plVar20 = local_80;
                if (iVar7 < 1) goto LAB_00114da3;
                goto LAB_00114de4;
              }
            }
            else if (((plVar16->value).sval.min <= (long)uVar17) &&
                    (lVar15 = (plVar16->value).sval.max, (long)uVar17 <= lVar15)) {
              if ((plVar11->value).sval.max <= lVar15) goto LAB_00114da3;
              goto LAB_00114de4;
            }
          }
          else if (((plVar16->value).uval.min <= uVar17) &&
                  (uVar8 = (plVar16->value).uval.max, uVar17 <= uVar8)) goto LAB_00114d7d;
          plVar16 = plVar16->next;
        } while( true );
      }
      do {
        plVar16 = plVar20;
        plVar20 = plVar16->next;
      } while (plVar20 != (len_ran_intv *)0x0);
      plVar16->next = __ptr;
      __ptr = plVar4;
    }
  }
  *ret = __ptr;
  iVar7 = 0;
switchD_0011460b_caseD_2:
  return iVar7;
LAB_00114d7d:
  if (uVar8 < (plVar11->value).uval.max) {
LAB_00114de4:
    while (plVar20 != (len_ran_intv *)0x0) {
      plVar16 = plVar20->next;
      free(plVar20);
      plVar20 = plVar16;
    }
    while (__ptr != (len_ran_intv *)0x0) {
      plVar16 = __ptr->next;
      free(__ptr);
      __ptr = plVar16;
    }
    return -1;
  }
LAB_00114da3:
  plVar11 = plVar11->next;
  goto LAB_00114d01;
}

Assistant:

int
resolve_len_ran_interval(struct ly_ctx *ctx, const char *str_restr, struct lys_type *type, struct len_ran_intv **ret)
{
    /* 0 - unsigned, 1 - signed, 2 - floating point */
    int kind;
    int64_t local_smin = 0, local_smax = 0, local_fmin, local_fmax;
    uint64_t local_umin, local_umax = 0;
    uint8_t local_fdig = 0;
    const char *seg_ptr, *ptr;
    struct len_ran_intv *local_intv = NULL, *tmp_local_intv = NULL, *tmp_intv, *intv = NULL;

    switch (type->base) {
    case LY_TYPE_BINARY:
        kind = 0;
        local_umin = 0;
        local_umax = 18446744073709551615UL;

        if (!str_restr && type->info.binary.length) {
            str_restr = type->info.binary.length->expr;
        }
        break;
    case LY_TYPE_DEC64:
        kind = 2;
        local_fmin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_fmax = __INT64_C(9223372036854775807);
        local_fdig = type->info.dec64.dig;

        if (!str_restr && type->info.dec64.range) {
            str_restr = type->info.dec64.range->expr;
        }
        break;
    case LY_TYPE_INT8:
        kind = 1;
        local_smin = __INT64_C(-128);
        local_smax = __INT64_C(127);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT16:
        kind = 1;
        local_smin = __INT64_C(-32768);
        local_smax = __INT64_C(32767);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT32:
        kind = 1;
        local_smin = __INT64_C(-2147483648);
        local_smax = __INT64_C(2147483647);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT64:
        kind = 1;
        local_smin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_smax = __INT64_C(9223372036854775807);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT8:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(255);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT16:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(65535);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT32:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(4294967295);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT64:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_STRING:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.str.length) {
            str_restr = type->info.str.length->expr;
        }
        break;
    default:
        return -1;
    }

    /* process superior types */
    if (type->der) {
        if (resolve_len_ran_interval(ctx, NULL, &type->der->type, &intv)) {
            return -1;
        }
        assert(!intv || (intv->kind == kind));
    }

    if (!str_restr) {
        /* we do not have any restriction, return superior ones */
        *ret = intv;
        return EXIT_SUCCESS;
    }

    /* adjust local min and max */
    if (intv) {
        tmp_intv = intv;

        if (kind == 0) {
            local_umin = tmp_intv->value.uval.min;
        } else if (kind == 1) {
            local_smin = tmp_intv->value.sval.min;
        } else if (kind == 2) {
            local_fmin = tmp_intv->value.fval.min;
        }

        while (tmp_intv->next) {
            tmp_intv = tmp_intv->next;
        }

        if (kind == 0) {
            local_umax = tmp_intv->value.uval.max;
        } else if (kind == 1) {
            local_smax = tmp_intv->value.sval.max;
        } else if (kind == 2) {
            local_fmax = tmp_intv->value.fval.max;
        }
    }

    /* finally parse our restriction */
    seg_ptr = str_restr;
    tmp_intv = NULL;
    while (1) {
        if (!tmp_local_intv) {
            assert(!local_intv);
            local_intv = malloc(sizeof *local_intv);
            tmp_local_intv = local_intv;
        } else {
            tmp_local_intv->next = malloc(sizeof *tmp_local_intv);
            tmp_local_intv = tmp_local_intv->next;
        }
        LY_CHECK_ERR_GOTO(!tmp_local_intv, LOGMEM(ctx), error);

        tmp_local_intv->kind = kind;
        tmp_local_intv->type = type;
        tmp_local_intv->next = NULL;

        /* min */
        ptr = seg_ptr;
        while (isspace(ptr[0])) {
            ++ptr;
        }
        if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = strtoull(ptr, (char **)&ptr, 10);
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = strtoll(ptr, (char **)&ptr, 10);
            } else if (kind == 2) {
                if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.min)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                    goto error;
                }
            }
        } else if (!strncmp(ptr, "min", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umin;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smin;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmin;
            }

            ptr += 3;
        } else if (!strncmp(ptr, "max", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umax;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smax;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmax;
            }

            ptr += 3;
        } else {
            goto error;
        }

        while (isspace(ptr[0])) {
            ptr++;
        }

        /* no interval or interval */
        if ((ptr[0] == '|') || !ptr[0]) {
            if (kind == 0) {
                tmp_local_intv->value.uval.max = tmp_local_intv->value.uval.min;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.max = tmp_local_intv->value.sval.min;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.max = tmp_local_intv->value.fval.min;
            }
        } else if (!strncmp(ptr, "..", 2)) {
            /* skip ".." */
            ptr += 2;
            while (isspace(ptr[0])) {
                ++ptr;
            }

            /* max */
            if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = strtoull(ptr, (char **)&ptr, 10);
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = strtoll(ptr, (char **)&ptr, 10);
                } else if (kind == 2) {
                    if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.max)) {
                        LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                        goto error;
                    }
                }
            } else if (!strncmp(ptr, "max", 3)) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = local_umax;
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = local_smax;
                } else if (kind == 2) {
                    tmp_local_intv->value.fval.max = local_fmax;
                }
            } else {
                goto error;
            }
        } else {
            goto error;
        }

        /* check min and max in correct order */
        if (kind == 0) {
            /* current segment */
            if (tmp_local_intv->value.uval.min > tmp_local_intv->value.uval.max) {
                goto error;
            }
            if (tmp_local_intv->value.uval.min < local_umin || tmp_local_intv->value.uval.max > local_umax) {
                goto error;
            }
            /* segments sholud be ascending order */
            if (tmp_intv && (tmp_intv->value.uval.max >= tmp_local_intv->value.uval.min)) {
                goto error;
            }
        } else if (kind == 1) {
            if (tmp_local_intv->value.sval.min > tmp_local_intv->value.sval.max) {
                goto error;
            }
            if (tmp_local_intv->value.sval.min < local_smin || tmp_local_intv->value.sval.max > local_smax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.sval.max >= tmp_local_intv->value.sval.min)) {
                goto error;
            }
        } else if (kind == 2) {
            if (tmp_local_intv->value.fval.min > tmp_local_intv->value.fval.max) {
                goto error;
            }
            if (tmp_local_intv->value.fval.min < local_fmin || tmp_local_intv->value.fval.max > local_fmax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.fval.max >= tmp_local_intv->value.fval.min)) {
                /* fraction-digits value is always the same (it cannot be changed in derived types) */
                goto error;
            }
        }

        /* next segment (next OR) */
        seg_ptr = strchr(seg_ptr, '|');
        if (!seg_ptr) {
            break;
        }
        seg_ptr++;
        tmp_intv = tmp_local_intv;
    }

    /* check local restrictions against superior ones */
    if (intv) {
        tmp_intv = intv;
        tmp_local_intv = local_intv;

        while (tmp_local_intv && tmp_intv) {
            /* reuse local variables */
            if (kind == 0) {
                local_umin = tmp_local_intv->value.uval.min;
                local_umax = tmp_local_intv->value.uval.max;

                /* it must be in this interval */
                if ((local_umin >= tmp_intv->value.uval.min) && (local_umin <= tmp_intv->value.uval.max)) {
                    /* this interval is covered, next one */
                    if (local_umax <= tmp_intv->value.uval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    /* ascending order of restrictions -> fail */
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 1) {
                local_smin = tmp_local_intv->value.sval.min;
                local_smax = tmp_local_intv->value.sval.max;

                if ((local_smin >= tmp_intv->value.sval.min) && (local_smin <= tmp_intv->value.sval.max)) {
                    if (local_smax <= tmp_intv->value.sval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 2) {
                local_fmin = tmp_local_intv->value.fval.min;
                local_fmax = tmp_local_intv->value.fval.max;

                 if ((dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.min, local_fdig) > -1)
                        && (dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1)) {
                    if (dec64cmp(local_fmax, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            }

            tmp_intv = tmp_intv->next;
        }

        /* some interval left uncovered -> fail */
        if (tmp_local_intv) {
            goto error;
        }
    }

    /* append the local intervals to all the intervals of the superior types, return it all */
    if (intv) {
        for (tmp_intv = intv; tmp_intv->next; tmp_intv = tmp_intv->next);
        tmp_intv->next = local_intv;
    } else {
        intv = local_intv;
    }
    *ret = intv;

    return EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }
    while (local_intv) {
        tmp_local_intv = local_intv->next;
        free(local_intv);
        local_intv = tmp_local_intv;
    }

    return -1;
}